

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O0

void Diligent::anon_unknown_61::ValidatePipelineResourceLayoutDesc
               (PipelineStateDesc *PSODesc,DeviceFeatures *Features)

{
  bool bVar1;
  SHADER_TYPE SVar2;
  pointer ppVar3;
  Char *pCVar4;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
  _Var5;
  _Hash_node_base *p_Var6;
  SHADER_TYPE ShaderStages;
  SHADER_TYPE ShaderStages_00;
  SHADER_TYPE ShaderStages_01;
  SHADER_TYPE ShaderStages_02;
  SHADER_TYPE ShaderStages_03;
  SHADER_TYPE ShaderStages_04;
  SHADER_TYPE ShaderStages_05;
  SHADER_TYPE ShaderStages_06;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>_>
  pVar7;
  char *local_3f8;
  char *local_3d8;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
  local_3b8;
  char *local_3a8;
  char *local_398;
  char *local_370;
  char *local_350;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
  local_330;
  char *local_320;
  char *local_310;
  String local_2f8;
  String local_2d8;
  char *local_2b8;
  char *local_2b0;
  undefined1 local_2a8 [8];
  string msg_1;
  String local_268;
  char *local_248;
  char *local_240;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
  local_238;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
  it_1;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>_>
  range_1;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  _Hash_node_base *local_1e0;
  ImmutableSamplerDesc *Sam;
  undefined1 local_1d0 [4];
  Uint32 i_1;
  unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
  UniqueSamplers;
  String local_190;
  String local_170;
  char *local_150;
  char *local_148;
  undefined1 local_140 [8];
  string msg;
  String local_100;
  char *local_e0;
  char *local_d8;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
  local_d0;
  _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
  it;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>_>
  range;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88 [3];
  char *local_70;
  _Hash_node_base *local_68;
  ShaderResourceVariableDesc *Var;
  undefined1 local_58 [4];
  Uint32 i;
  unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
  UniqueVariables;
  PipelineResourceLayoutDesc *Layout;
  DeviceFeatures *Features_local;
  PipelineStateDesc *PSODesc_local;
  
  UniqueVariables._M_h._M_single_bucket = (__node_base_ptr)&PSODesc->ResourceLayout;
  std::
  unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
  ::unordered_multimap
            ((unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
              *)local_58);
  for (Var._4_4_ = 0; Var._4_4_ < *(uint *)&UniqueVariables._M_h._M_single_bucket[1]._M_nxt;
      Var._4_4_ = Var._4_4_ + 1) {
    local_68 = UniqueVariables._M_h._M_single_bucket[2]._M_nxt + (ulong)Var._4_4_ * 2;
    if (local_68->_M_nxt == (_Hash_node_base *)0x0) {
      local_70 = GetPipelineTypeString(PSODesc->PipelineType);
      if ((PSODesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_310 = "";
      }
      else {
        local_310 = (PSODesc->super_DeviceObjectAttribs).Name;
      }
      local_88[0] = local_310;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[26],unsigned_int,char[25]>
                (false,"ValidatePipelineResourceLayoutDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x1d9,(char (*) [16])"Description of ",&local_70,(char (*) [7])0xc0e54c,local_88,
                 (char (*) [15])"\' is invalid: ",(char (*) [26])"ResourceLayout.Variables[",
                 (uint *)((long)&Var + 4),(char (*) [25])"].Name must not be null.");
    }
    if (*(char *)&local_68->_M_nxt->_M_nxt == '\0') {
      local_90 = GetPipelineTypeString(PSODesc->PipelineType);
      if ((PSODesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_320 = "";
      }
      else {
        local_320 = (PSODesc->super_DeviceObjectAttribs).Name;
      }
      local_98 = local_320;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[26],unsigned_int,char[26]>
                (false,"ValidatePipelineResourceLayoutDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x1dc,(char (*) [16])"Description of ",&local_90,(char (*) [7])0xc0e54c,&local_98,
                 (char (*) [15])"\' is invalid: ",(char (*) [26])"ResourceLayout.Variables[",
                 (uint *)((long)&Var + 4),(char (*) [26])"].Name must not be empty.");
    }
    if (*(int *)&local_68[1]._M_nxt == 0) {
      local_a0 = GetPipelineTypeString(PSODesc->PipelineType);
      if ((PSODesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_330._M_cur = (__node_type *)0xc361e0;
      }
      else {
        local_330._M_cur = (__node_type *)(PSODesc->super_DeviceObjectAttribs).Name;
      }
      range.second.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                 )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                   )local_330._M_cur;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[26],unsigned_int,char[48]>
                (false,"ValidatePipelineResourceLayoutDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x1df,(char (*) [16])"Description of ",&local_a0,(char (*) [7])0xc0e54c,
                 (char **)&range.second,(char (*) [15])"\' is invalid: ",
                 (char (*) [26])"ResourceLayout.Variables[",(uint *)((long)&Var + 4),
                 (char (*) [48])"].ShaderStages must not be SHADER_TYPE_UNKNOWN.");
    }
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&it,(Char *)local_68->_M_nxt,false);
    pVar7 = std::
            unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
            ::equal_range((unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
                           *)local_58,(key_type *)&it);
    range.first = pVar7.second.
                  super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                  ._M_cur;
    _Var5 = pVar7.first.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
    ;
    HashMapStringKey::~HashMapStringKey((HashMapStringKey *)&it);
    local_d0 = pVar7.first.
               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
               ._M_cur.
               super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
    ;
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&local_d0,
                         (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                          *)&range);
      if (!bVar1) break;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                             *)&local_d0);
      SVar2 = Diligent::operator&(ppVar3->second,*(SHADER_TYPE *)&local_68[1]._M_nxt);
      if (SVar2 != SHADER_TYPE_UNKNOWN) {
        local_d8 = GetPipelineTypeString(PSODesc->PipelineType);
        p_Var6 = local_68;
        if ((PSODesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_350 = "";
        }
        else {
          local_350 = (PSODesc->super_DeviceObjectAttribs).Name;
        }
        local_e0 = local_350;
        GetShaderStagesString_abi_cxx11_
                  (&local_100,(Diligent *)(ulong)*(uint *)&local_68[1]._M_nxt,ShaderStages);
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                               *)&local_d0);
        GetShaderStagesString_abi_cxx11_
                  ((String *)((long)&msg.field_2 + 8),(Diligent *)(ulong)ppVar3->second,
                   ShaderStages_00);
        _Var5._M_cur = (__node_type *)0x1e8;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[18],char_const*,char[44],std::__cxx11::string,char[6],std::__cxx11::string,char[99]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x1e8,(char (*) [16])"Description of ",&local_d8,(char (*) [7])0xc0e54c,
                   &local_e0,(char (*) [15])"\' is invalid: ",(char (*) [18])"Shader variable \'",
                   (char **)p_Var6,(char (*) [44])"\' is defined in overlapping shader stages (",
                   &local_100,(char (*) [6])0xd2e8ea,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&msg.field_2 + 8),
                   (char (*) [99])
                   "). Multiple variables with the same name are allowed, but shader stages they use must not overlap."
                  );
        std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_100);
      }
      if (Features->SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                               *)&local_d0);
        if (ppVar3->second == SHADER_TYPE_UNKNOWN) {
          FormatString<char[26],char[34]>
                    ((string *)local_140,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"it->second != SHADER_TYPE_UNKNOWN",(char (*) [34])_Var5._M_cur)
          ;
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"ValidatePipelineResourceLayoutDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x1ec);
          std::__cxx11::string::~string((string *)local_140);
        }
        local_148 = GetPipelineTypeString(PSODesc->PipelineType);
        p_Var6 = local_68;
        if ((PSODesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_370 = "";
        }
        else {
          local_370 = (PSODesc->super_DeviceObjectAttribs).Name;
        }
        local_150 = local_370;
        GetShaderStagesString_abi_cxx11_
                  (&local_170,(Diligent *)(ulong)*(uint *)&local_68[1]._M_nxt,ShaderStages_01);
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                               *)&local_d0);
        GetShaderStagesString_abi_cxx11_
                  (&local_190,(Diligent *)(ulong)ppVar3->second,ShaderStages_02);
        _Var5._M_cur = (__node_type *)0x1f2;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[98],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[184]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x1f2,(char (*) [16])"Description of ",&local_148,(char (*) [7])0xc0e54c,
                   &local_150,(char (*) [15])"\' is invalid: ",
                   (char (*) [98])
                   "This device does not support separable programs, but there are separate resources with the name \'"
                   ,(char **)p_Var6,(char (*) [20])"\' in shader stages ",&local_170,
                   (char (*) [6])0xd2e8ea,&local_190,(char (*) [184])0xcc8be3);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_170);
      }
      std::__detail::
      _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
      ::operator++((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                    *)&local_d0);
    }
    UniqueSamplers._M_h._M_single_bucket =
         (__node_base_ptr)
         std::
         unordered_multimap<Diligent::HashMapStringKey,Diligent::SHADER_TYPE,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>>
         ::emplace<char_const*const&,Diligent::SHADER_TYPE_const&>
                   ((unordered_multimap<Diligent::HashMapStringKey,Diligent::SHADER_TYPE,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>>
                     *)local_58,(char **)local_68,(SHADER_TYPE *)(local_68 + 1));
  }
  std::
  unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
  ::~unordered_multimap
            ((unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
              *)local_58);
  std::
  unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
  ::unordered_multimap
            ((unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
              *)local_1d0);
  for (Sam._4_4_ = 0; Sam._4_4_ < *(uint *)&UniqueVariables._M_h._M_single_bucket[3]._M_nxt;
      Sam._4_4_ = Sam._4_4_ + 1) {
    local_1e0 = UniqueVariables._M_h._M_single_bucket[4]._M_nxt + (ulong)Sam._4_4_ * 9;
    if (local_1e0[1]._M_nxt == (_Hash_node_base *)0x0) {
      local_1e8 = GetPipelineTypeString(PSODesc->PipelineType);
      if ((PSODesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_398 = "";
      }
      else {
        local_398 = (PSODesc->super_DeviceObjectAttribs).Name;
      }
      local_1f0 = local_398;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[41]>
                (false,"ValidatePipelineResourceLayoutDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x1ff,(char (*) [16])"Description of ",&local_1e8,(char (*) [7])0xc0e54c,
                 &local_1f0,(char (*) [15])"\' is invalid: ",
                 (char (*) [34])"ResourceLayout.ImmutableSamplers[",(uint *)((long)&Sam + 4),
                 (char (*) [41])"].SamplerOrTextureName must not be null.");
    }
    if (*(char *)&(local_1e0[1]._M_nxt)->_M_nxt == '\0') {
      local_1f8 = GetPipelineTypeString(PSODesc->PipelineType);
      if ((PSODesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_3a8 = "";
      }
      else {
        local_3a8 = (PSODesc->super_DeviceObjectAttribs).Name;
      }
      local_200 = local_3a8;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[42]>
                (false,"ValidatePipelineResourceLayoutDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x202,(char (*) [16])"Description of ",&local_1f8,(char (*) [7])0xc0e54c,
                 &local_200,(char (*) [15])"\' is invalid: ",
                 (char (*) [34])"ResourceLayout.ImmutableSamplers[",(uint *)((long)&Sam + 4),
                 (char (*) [42])"].SamplerOrTextureName must not be empty.");
    }
    if (*(int *)&local_1e0->_M_nxt == 0) {
      local_208 = GetPipelineTypeString(PSODesc->PipelineType);
      if ((PSODesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_3b8._M_cur = (__node_type *)0xc361e0;
      }
      else {
        local_3b8._M_cur = (__node_type *)(PSODesc->super_DeviceObjectAttribs).Name;
      }
      range_1.second.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
      ._M_cur = (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                 )(_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                   )local_3b8._M_cur;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[34],unsigned_int,char[48]>
                (false,"ValidatePipelineResourceLayoutDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x205,(char (*) [16])"Description of ",&local_208,(char (*) [7])0xc0e54c,
                 (char **)&range_1.second,(char (*) [15])"\' is invalid: ",
                 (char (*) [34])"ResourceLayout.ImmutableSamplers[",(uint *)((long)&Sam + 4),
                 (char (*) [48])"].ShaderStages must not be SHADER_TYPE_UNKNOWN.");
    }
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&it_1,(Char *)local_1e0[1]._M_nxt,false);
    pVar7 = std::
            unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
            ::equal_range((unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
                           *)local_1d0,(key_type *)&it_1);
    range_1.first =
         pVar7.second.
         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
         ._M_cur;
    _Var5 = pVar7.first.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
            ._M_cur.
            super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
    ;
    HashMapStringKey::~HashMapStringKey((HashMapStringKey *)&it_1);
    local_238 = pVar7.first.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
    ;
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&local_238,
                         (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false>
                          *)&range_1);
      if (!bVar1) break;
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                             *)&local_238);
      SVar2 = Diligent::operator&(ppVar3->second,*(SHADER_TYPE *)&local_1e0->_M_nxt);
      if (SVar2 != SHADER_TYPE_UNKNOWN) {
        local_240 = GetPipelineTypeString(PSODesc->PipelineType);
        if ((PSODesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_3d8 = "";
        }
        else {
          local_3d8 = (PSODesc->super_DeviceObjectAttribs).Name;
        }
        local_248 = local_3d8;
        p_Var6 = local_1e0 + 1;
        GetShaderStagesString_abi_cxx11_
                  (&local_268,(Diligent *)(ulong)*(uint *)&local_1e0->_M_nxt,ShaderStages_03);
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                               *)&local_238);
        GetShaderStagesString_abi_cxx11_
                  ((String *)((long)&msg_1.field_2 + 8),(Diligent *)(ulong)ppVar3->second,
                   ShaderStages_04);
        _Var5._M_cur = (__node_type *)0x20e;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[20],char_const*,char[44],std::__cxx11::string,char[6],std::__cxx11::string,char[108]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x20e,(char (*) [16])"Description of ",&local_240,(char (*) [7])0xc0e54c,
                   &local_248,(char (*) [15])"\' is invalid: ",(char (*) [20])"Immutable sampler \'"
                   ,(char **)p_Var6,(char (*) [44])"\' is defined in overlapping shader stages (",
                   &local_268,(char (*) [6])0xd2e8ea,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&msg_1.field_2 + 8),
                   (char (*) [108])
                   "). Multiple immutable samplers with the same name are allowed, but shader stages they use must not overlap."
                  );
        std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&local_268);
      }
      if (Features->SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                               *)&local_238);
        if (ppVar3->second == SHADER_TYPE_UNKNOWN) {
          FormatString<char[26],char[34]>
                    ((string *)local_2a8,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"it->second != SHADER_TYPE_UNKNOWN",(char (*) [34])_Var5._M_cur)
          ;
          pCVar4 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar4,"ValidatePipelineResourceLayoutDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                     ,0x212);
          std::__cxx11::string::~string((string *)local_2a8);
        }
        local_2b0 = GetPipelineTypeString(PSODesc->PipelineType);
        if ((PSODesc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_3f8 = "";
        }
        else {
          local_3f8 = (PSODesc->super_DeviceObjectAttribs).Name;
        }
        local_2b8 = local_3f8;
        p_Var6 = local_1e0 + 1;
        GetShaderStagesString_abi_cxx11_
                  (&local_2d8,(Diligent *)(ulong)*(uint *)&local_1e0->_M_nxt,ShaderStages_05);
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                               *)&local_238);
        GetShaderStagesString_abi_cxx11_
                  (&local_2f8,(Diligent *)(ulong)ppVar3->second,ShaderStages_06);
        _Var5._M_cur = (__node_type *)0x218;
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[107],char_const*,char[20],std::__cxx11::string,char[6],std::__cxx11::string,char[192]>
                  (false,"ValidatePipelineResourceLayoutDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x218,(char (*) [16])"Description of ",&local_2b0,(char (*) [7])0xc0e54c,
                   &local_2b8,(char (*) [15])"\' is invalid: ",
                   (char (*) [107])
                   "This device does not support separable programs, but there are separate immutable samplers with the name \'"
                   ,(char **)p_Var6,(char (*) [20])"\' in shader stages ",&local_2d8,
                   (char (*) [6])0xd2e8ea,&local_2f8,
                   (char (*) [192])
                   ". When separable programs are not supported, every resource is always shared between all stages. Use distinct immutable sampler names for each stage or define a single sampler for all stages."
                  );
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      std::__detail::
      _Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
      ::operator++((_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>,_false,_false>
                    *)&local_238);
    }
    std::
    unordered_multimap<Diligent::HashMapStringKey,Diligent::SHADER_TYPE,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>>
    ::emplace<char_const*const&,Diligent::SHADER_TYPE_const&>
              ((unordered_multimap<Diligent::HashMapStringKey,Diligent::SHADER_TYPE,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::SHADER_TYPE>>>
                *)local_1d0,(char **)(local_1e0 + 1),(SHADER_TYPE *)local_1e0);
  }
  std::
  unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
  ::~unordered_multimap
            ((unordered_multimap<Diligent::HashMapStringKey,_Diligent::SHADER_TYPE,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::SHADER_TYPE>_>_>
              *)local_1d0);
  return;
}

Assistant:

void ValidatePipelineResourceLayoutDesc(const PipelineStateDesc& PSODesc, const DeviceFeatures& Features) noexcept(false)
{
    const PipelineResourceLayoutDesc& Layout = PSODesc.ResourceLayout;
    {
        std::unordered_multimap<HashMapStringKey, SHADER_TYPE> UniqueVariables;
        for (Uint32 i = 0; i < Layout.NumVariables; ++i)
        {
            const ShaderResourceVariableDesc& Var = Layout.Variables[i];

            if (Var.Name == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.Variables[", i, "].Name must not be null.");

            if (Var.Name[0] == '\0')
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.Variables[", i, "].Name must not be empty.");

            if (Var.ShaderStages == SHADER_TYPE_UNKNOWN)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.Variables[", i, "].ShaderStages must not be SHADER_TYPE_UNKNOWN.");

            auto range = UniqueVariables.equal_range(Var.Name);
            for (auto it = range.first; it != range.second; ++it)
            {
                if ((it->second & Var.ShaderStages) != 0)
                {
                    LOG_PSO_ERROR_AND_THROW("Shader variable '", Var.Name, "' is defined in overlapping shader stages (", GetShaderStagesString(Var.ShaderStages),
                                            " and ", GetShaderStagesString(it->second),
                                            "). Multiple variables with the same name are allowed, but shader stages they use must not overlap.");
                }
                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(it->second != SHADER_TYPE_UNKNOWN);
                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but there are separate resources with the name '",
                                            Var.Name, "' in shader stages ",
                                            GetShaderStagesString(Var.ShaderStages), " and ",
                                            GetShaderStagesString(it->second),
                                            ". When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct resource names for each stage or define a single resource for all stages.");
                }
            }
            UniqueVariables.emplace(Var.Name, Var.ShaderStages);
        }
    }
    {
        std::unordered_multimap<HashMapStringKey, SHADER_TYPE> UniqueSamplers;
        for (Uint32 i = 0; i < Layout.NumImmutableSamplers; ++i)
        {
            const ImmutableSamplerDesc& Sam = Layout.ImmutableSamplers[i];

            if (Sam.SamplerOrTextureName == nullptr)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.ImmutableSamplers[", i, "].SamplerOrTextureName must not be null.");

            if (Sam.SamplerOrTextureName[0] == '\0')
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.ImmutableSamplers[", i, "].SamplerOrTextureName must not be empty.");

            if (Sam.ShaderStages == SHADER_TYPE_UNKNOWN)
                LOG_PSO_ERROR_AND_THROW("ResourceLayout.ImmutableSamplers[", i, "].ShaderStages must not be SHADER_TYPE_UNKNOWN.");

            auto range = UniqueSamplers.equal_range(Sam.SamplerOrTextureName);
            for (auto it = range.first; it != range.second; ++it)
            {
                if ((it->second & Sam.ShaderStages) != 0)
                {
                    LOG_PSO_ERROR_AND_THROW("Immutable sampler '", Sam.SamplerOrTextureName, "' is defined in overlapping shader stages (", GetShaderStagesString(Sam.ShaderStages),
                                            " and ", GetShaderStagesString(it->second),
                                            "). Multiple immutable samplers with the same name are allowed, but shader stages they use must not overlap.");
                }
                if (Features.SeparablePrograms == DEVICE_FEATURE_STATE_DISABLED)
                {
                    VERIFY_EXPR(it->second != SHADER_TYPE_UNKNOWN);
                    LOG_PSO_ERROR_AND_THROW("This device does not support separable programs, but there are separate immutable samplers with the name '",
                                            Sam.SamplerOrTextureName, "' in shader stages ",
                                            GetShaderStagesString(Sam.ShaderStages), " and ",
                                            GetShaderStagesString(it->second),
                                            ". When separable programs are not supported, every resource is always shared between all stages. "
                                            "Use distinct immutable sampler names for each stage or define a single sampler for all stages.");
                }
            }
            UniqueSamplers.emplace(Sam.SamplerOrTextureName, Sam.ShaderStages);
        }
    }
}